

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::init_peer_class_filter(session_impl *this,bool unlimited_local)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  address local_110;
  address local_f0;
  undefined1 local_d0 [8];
  address_v6 end_1;
  address_v6 begin_1;
  error_code ec_1;
  int i_1;
  address local_68;
  address_v4 local_48;
  address_v4 local_44;
  address_v4 end;
  address_v4 begin;
  error_code ec;
  int i;
  int len;
  class_mapping *p;
  uint32_t gfilter;
  uint32_t lfilter;
  bool unlimited_local_local;
  session_impl *this_local;
  
  uVar2 = strong_typedef::operator_cast_to_unsigned_int((strong_typedef *)&this->m_local_peer_class)
  ;
  uVar3 = 1 << ((byte)uVar2 & 0x1f);
  uVar2 = strong_typedef::operator_cast_to_unsigned_int((strong_typedef *)&this->m_global_class);
  uVar4 = 1 << ((byte)uVar2 & 0x1f);
  if ((init_peer_class_filter(bool)::v4_classes == '\0') &&
     (iVar5 = __cxa_guard_acquire(&init_peer_class_filter(bool)::v4_classes), iVar5 != 0)) {
    init_peer_class_filter::v4_classes[0].first = "0.0.0.0";
    init_peer_class_filter::v4_classes[0].last = "255.255.255.255";
    init_peer_class_filter::v4_classes[1].first = "10.0.0.0";
    init_peer_class_filter::v4_classes[1].last = "10.255.255.255";
    init_peer_class_filter::v4_classes[2].first = "172.16.0.0";
    init_peer_class_filter::v4_classes[2].last = "172.31.255.255";
    init_peer_class_filter::v4_classes[3].first = "192.168.0.0";
    init_peer_class_filter::v4_classes[3].last = "192.168.255.255";
    init_peer_class_filter::v4_classes[4].first = "169.254.0.0";
    init_peer_class_filter::v4_classes[4].last = "169.254.255.255";
    init_peer_class_filter::v4_classes[5].first = "127.0.0.0";
    init_peer_class_filter::v4_classes[5].last = "127.255.255.255";
    init_peer_class_filter::v4_classes[0].filter = uVar4;
    init_peer_class_filter::v4_classes[1].filter = uVar3;
    init_peer_class_filter::v4_classes[2].filter = uVar3;
    init_peer_class_filter::v4_classes[3].filter = uVar3;
    init_peer_class_filter::v4_classes[4].filter = uVar3;
    init_peer_class_filter::v4_classes[5].filter = uVar3;
    __cxa_guard_release(&init_peer_class_filter(bool)::v4_classes);
  }
  if ((init_peer_class_filter(bool)::v6_classes == '\0') &&
     (iVar5 = __cxa_guard_acquire(&init_peer_class_filter(bool)::v6_classes), iVar5 != 0)) {
    init_peer_class_filter::v6_classes[0].first = "::0";
    init_peer_class_filter::v6_classes[0].last = "ffff:ffff:ffff:ffff:ffff:ffff:ffff:ffff";
    init_peer_class_filter::v6_classes[1].first = "fc00::";
    init_peer_class_filter::v6_classes[1].last = "fdff:ffff:ffff:ffff:ffff:ffff:ffff:ffff";
    init_peer_class_filter::v6_classes[2].first = "fe80::";
    init_peer_class_filter::v6_classes[2].last = "febf::ffff:ffff:ffff:ffff:ffff:ffff:ffff";
    init_peer_class_filter::v6_classes[3].first = "::1";
    init_peer_class_filter::v6_classes[3].last = "::1";
    init_peer_class_filter::v6_classes[0].filter = uVar4;
    init_peer_class_filter::v6_classes[1].filter = uVar3;
    init_peer_class_filter::v6_classes[2].filter = uVar3;
    init_peer_class_filter::v6_classes[3].filter = uVar3;
    __cxa_guard_release(&init_peer_class_filter(bool)::v6_classes);
  }
  ec.cat_._4_4_ = 6;
  if (!unlimited_local) {
    ec.cat_._4_4_ = 1;
  }
  for (ec.cat_._0_4_ = 0; (int)ec.cat_ < ec.cat_._4_4_; ec.cat_._0_4_ = (int)ec.cat_ + 1) {
    boost::system::error_code::error_code((error_code *)&end);
    boost::asio::ip::make_address_v4
              ((ip *)&local_44,init_peer_class_filter::v4_classes[(int)ec.cat_].first,
               (error_code *)&end);
    boost::asio::ip::make_address_v4
              ((ip *)&local_48,init_peer_class_filter::v4_classes[(int)ec.cat_].last,
               (error_code *)&end);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&end);
    if (!bVar1) {
      boost::asio::ip::address::address(&local_68,&local_44);
      boost::asio::ip::address::address((address *)&stack0xffffffffffffff78,&local_48);
      ip_filter::add_rule(&this->m_peer_class_filter,&local_68,(address *)&stack0xffffffffffffff78,
                          init_peer_class_filter::v4_classes[(int)ec.cat_].filter);
    }
  }
  ec.cat_._4_4_ = 4;
  if (!unlimited_local) {
    ec.cat_._4_4_ = 1;
  }
  for (ec_1.cat_._4_4_ = 0; ec_1.cat_._4_4_ < ec.cat_._4_4_; ec_1.cat_._4_4_ = ec_1.cat_._4_4_ + 1)
  {
    boost::system::error_code::error_code((error_code *)&begin_1.scope_id_);
    boost::asio::ip::make_address_v6
              ((address_v6 *)&end_1.scope_id_,
               init_peer_class_filter::v6_classes[ec_1.cat_._4_4_].first,
               (error_code *)&begin_1.scope_id_);
    boost::asio::ip::make_address_v6
              ((address_v6 *)local_d0,init_peer_class_filter::v6_classes[ec_1.cat_._4_4_].last,
               (error_code *)&begin_1.scope_id_);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&begin_1.scope_id_);
    if (!bVar1) {
      boost::asio::ip::address::address(&local_f0,(address_v6 *)&end_1.scope_id_);
      boost::asio::ip::address::address(&local_110,(address_v6 *)local_d0);
      ip_filter::add_rule(&this->m_peer_class_filter,&local_f0,&local_110,
                          init_peer_class_filter::v6_classes[ec_1.cat_._4_4_].filter);
    }
  }
  return;
}

Assistant:

void session_impl::init_peer_class_filter(bool unlimited_local)
	{
		// set the default peer_class_filter to use the local peer class
		// for peers on local networks
		std::uint32_t lfilter = 1 << static_cast<std::uint32_t>(m_local_peer_class);
		std::uint32_t gfilter = 1 << static_cast<std::uint32_t>(m_global_class);

		struct class_mapping
		{
			char const* first;
			char const* last;
			std::uint32_t filter;
		};

		static const class_mapping v4_classes[] =
		{
			// everything
			{"0.0.0.0", "255.255.255.255", gfilter},
			// local networks
			{"10.0.0.0", "10.255.255.255", lfilter},
			{"172.16.0.0", "172.31.255.255", lfilter},
			{"192.168.0.0", "192.168.255.255", lfilter},
			// link-local
			{"169.254.0.0", "169.254.255.255", lfilter},
			// loop-back
			{"127.0.0.0", "127.255.255.255", lfilter},
		};

		static const class_mapping v6_classes[] =
		{
			// everything
			{"::0", "ffff:ffff:ffff:ffff:ffff:ffff:ffff:ffff", gfilter},
			// local networks
			{"fc00::", "fdff:ffff:ffff:ffff:ffff:ffff:ffff:ffff", lfilter},
			// link-local
			{"fe80::", "febf::ffff:ffff:ffff:ffff:ffff:ffff:ffff", lfilter},
			// loop-back
			{"::1", "::1", lfilter},
		};

		class_mapping const* p = v4_classes;
		int len = sizeof(v4_classes) / sizeof(v4_classes[0]);
		if (!unlimited_local) len = 1;
		for (int i = 0; i < len; ++i)
		{
			error_code ec;
			address_v4 begin = make_address_v4(p[i].first, ec);
			address_v4 end = make_address_v4(p[i].last, ec);
			if (ec) continue;
			m_peer_class_filter.add_rule(begin, end, p[i].filter);
		}
		p = v6_classes;
		len = sizeof(v6_classes) / sizeof(v6_classes[0]);
		if (!unlimited_local) len = 1;
		for (int i = 0; i < len; ++i)
		{
			error_code ec;
			address_v6 begin = make_address_v6(p[i].first, ec);
			address_v6 end = make_address_v6(p[i].last, ec);
			if (ec) continue;
			m_peer_class_filter.add_rule(begin, end, p[i].filter);
		}
	}